

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O2

void continuous_dist_test_integrate_pdf<trng::normal_dist<double>>(normal_dist<double> *d)

{
  int i;
  int iVar1;
  result_type_conflict2 rVar2;
  result_type_conflict2 rVar3;
  double dVar4;
  value_type vVar5;
  result_type tol;
  vector<double,_std::allocator<double>_> y;
  double local_c0;
  SourceLineInfo local_b8;
  AssertionHandler catchAssertionHandler;
  BinaryExpr<const_double_&,_const_double_&> local_60;
  StringRef local_30;
  
  rVar2 = trng::normal_dist<double>::icdf(d,0.01);
  rVar3 = trng::normal_dist<double>::icdf(d,0.99);
  dVar4 = (rVar3 - rVar2) * 9.5367431640625e-07;
  y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  for (iVar1 = 0; iVar1 != 0x100001; iVar1 = iVar1 + 1) {
    catchAssertionHandler.m_assertionInfo.macroName.m_start =
         (char *)trng::normal_dist<double>::pdf(d,(double)iVar1 * dVar4 + rVar2);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&y,(double *)&catchAssertionHandler);
  }
  vVar5 = simpson_int<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                    ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  tol = 5.820766091346741e-11;
  local_60.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x2602f7;
  local_60.super_ITransientExpression.m_isBinaryExpression = true;
  local_60.super_ITransientExpression.m_result = false;
  local_60.super_ITransientExpression._10_6_ = 0;
  local_b8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_b8.line = 0x94;
  Catch::StringRef::StringRef(&local_30,"std::abs(s - result_type(98) / result_type(100)) < tol");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_60,&local_b8,local_30,Normal);
  local_c0 = ABS(dVar4 * vVar5 + -0.98);
  local_b8.file = (char *)&local_c0;
  Catch::ExprLhs<double_const&>::operator<(&local_60,(ExprLhs<double_const&> *)&local_b8,&tol);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_60.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_60.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&y.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void continuous_dist_test_integrate_pdf(const dist &d) {
  using result_type = typename dist::result_type;
  const int samples(static_cast<int>(std::min(
      1024ll * 1024, static_cast<long long>(std::round(
                         1 / std::sqrt(std::numeric_limits<result_type>::epsilon()))))));
  const result_type x_min{d.icdf(result_type(1) / result_type(100))};
  const result_type x_max{d.icdf(result_type(99) / result_type(100))};
  const result_type dx{(x_max - x_min) / samples};
  std::vector<result_type> y;
  for (int i{0}; i <= samples; ++i)
    y.push_back(d.pdf(x_min + i * dx));
  const result_type s{simpson_int(y.begin(), y.end()) * dx};
  const result_type tol{result_type(64) / result_type(samples) / result_type(samples)};
  REQUIRE(std::abs(s - result_type(98) / result_type(100)) < tol);
}